

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

bool IsLogoProfTrack(Track *track)

{
  int iVar1;
  pointer pSVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Sector *pSVar6;
  Track *__range1;
  Sector *s;
  pointer this;
  
  iVar4 = Track::size(track);
  if ((iVar4 == 10) || (iVar4 = Track::size(track), iVar4 == 0xb)) {
    pSVar2 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar4 = 2;
    for (this = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                super__Vector_impl_data._M_start; iVar5 = Track::size(track), this != pSVar2;
        this = this + 1) {
      iVar1 = (this->header).sector;
      if ((iVar5 == 0xb) && (iVar1 == 1)) {
        bVar3 = Sector::has_badidcrc(this);
        if (!bVar3) goto LAB_00175123;
      }
      else {
        if (this->datarate != _250K) {
          return false;
        }
        if (this->encoding != MFM) {
          return false;
        }
        if (((iVar1 != iVar4) || (iVar5 = Sector::size(this), iVar5 != 0x200)) ||
           (bVar3 = Sector::has_good_data(this), !bVar3)) goto LAB_00175123;
        iVar4 = iVar4 + 1;
      }
    }
    if (iVar5 == 10) {
      iVar4 = Sector::SizeCodeToLength(1);
      iVar5 = GetSectorOverhead(MFM);
      pSVar6 = Track::operator[](track,0);
      if (pSVar6->offset < (iVar5 + iVar4) * 0x10) {
        return false;
      }
    }
    bVar3 = true;
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [31])"detected Logo Professor track\n");
    }
  }
  else {
LAB_00175123:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool IsLogoProfTrack(const Track& track)
{
    // Accept track with or without placeholder sector
    if (track.size() != 10 && track.size() != 11)
        return false;

    // First non-placeholder sector id.
    int id = 2;

    for (auto& s : track)
    {
        // Check for placeholder sector, present in old EDSK images.
        if (track.size() == 11 && s.header.sector == 1)
        {
            // It must have a bad ID header CRC.
            if (s.has_badidcrc())
                continue;
            else
                return false;
        }

        // Ensure each sector is double-density MFM, 512-bytes, with good data
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM ||
            s.header.sector != id++ || s.size() != 512 || !s.has_good_data())
            return false;
    }

    // If there's no placeholder, the first sector must begin late
    if (track.size() == 10)
    {
        // Determine an offset considered late
        auto min_offset = Sector::SizeCodeToLength(1) + GetSectorOverhead(Encoding::MFM);

        // Reject if first sector doesn't start late on the track
        if (track[0].offset < (min_offset * 16))
            return false;
    }

    if (opt.debug) util::cout << "detected Logo Professor track\n";
    return true;
}